

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O1

void av1_decode_xq(int *xqd,int *xq,sgr_params_type *params)

{
  int iVar1;
  int iVar2;
  
  if (params->r[0] == 0) {
    *xq = 0;
    iVar2 = 0x80 - xqd[1];
  }
  else {
    iVar2 = params->r[1];
    iVar1 = *xqd;
    *xq = iVar1;
    if (iVar2 == 0) {
      iVar2 = 0;
    }
    else {
      iVar2 = 0x80 - (iVar1 + xqd[1]);
    }
  }
  xq[1] = iVar2;
  return;
}

Assistant:

void av1_decode_xq(const int *xqd, int *xq, const sgr_params_type *params) {
  if (params->r[0] == 0) {
    xq[0] = 0;
    xq[1] = (1 << SGRPROJ_PRJ_BITS) - xqd[1];
  } else if (params->r[1] == 0) {
    xq[0] = xqd[0];
    xq[1] = 0;
  } else {
    xq[0] = xqd[0];
    xq[1] = (1 << SGRPROJ_PRJ_BITS) - xq[0] - xqd[1];
  }
}